

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O1

void emit_lib(BuildCtx *ctx)

{
  char **ppcVar1;
  FILE *pFVar2;
  FILE *pFVar3;
  uint uVar4;
  int iVar5;
  FILE *pFVar6;
  FILE *unaff_RBP;
  undefined7 uVar8;
  undefined1 *puVar7;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  LibDefHandler *unaff_R13;
  uint8_t *puVar12;
  int iVar13;
  ulong unaff_R15;
  char buf [256];
  char acStack_1d0 [88];
  BuildCtx *pBStack_178;
  char *pcStack_170;
  LibDefHandler *pLStack_168;
  FILE *pFStack_160;
  ulong uStack_158;
  FILE *pFStack_150;
  FILE *local_140;
  FILE local_138;
  
  if (ctx->mode - BUILD_ffdef < 3) {
    pFVar6 = (FILE *)ctx->fp;
    pcVar10 = "/* This is a generated file. DO NOT EDIT! */\n\n";
    sVar9 = 0x2e;
LAB_0010b536:
    pFStack_150 = (FILE *)0x10b540;
    fwrite(pcVar10,sVar9,1,pFVar6);
  }
  else if (ctx->mode == BUILD_vmdef) {
    pFVar6 = (FILE *)ctx->fp;
    pcVar10 = "ffnames = {\n[0]=\"Lua\",\n\"C\",\n";
    sVar9 = 0x1c;
    goto LAB_0010b536;
  }
  if (ctx->mode == BUILD_recdef) {
    pFStack_150 = (FILE *)0x10b560;
    fwrite("static const uint16_t recff_idmap[] = {\n0,\n0x0100",0x31,1,(FILE *)ctx->fp);
  }
  ffid = 2;
  recffid = 2;
  ffasmfunc = 0;
  while( true ) {
    ppcVar1 = ctx->args;
    ctx->args = ppcVar1 + 1;
    pcVar10 = *ppcVar1;
    if (pcVar10 == (char *)0x0) break;
    if ((*pcVar10 != '-') || (pFVar6 = _stdin, pcVar10[1] != '\0')) {
      pFStack_150 = (FILE *)0x10b5b5;
      pFVar6 = fopen(pcVar10,"r");
      if (pFVar6 == (FILE *)0x0) {
LAB_0010b981:
        pFStack_150 = (FILE *)libdef_endmodule;
        pcVar11 = pcVar10;
        emit_lib_cold_1();
        if (modstate != 0) {
          pBStack_178 = ctx;
          pcStack_170 = pcVar10;
          pLStack_168 = unaff_R13;
          pFStack_160 = pFVar6;
          uStack_158 = unaff_R15;
          pFStack_150 = unaff_RBP;
          if (modstate == 1) {
            fwrite("  (lua_CFunction)0",0x12,1,*(FILE **)(pcVar11 + 0x10));
          }
          fwrite("\n};\n",4,1,*(FILE **)(pcVar11 + 0x10));
          fprintf(*(FILE **)(pcVar11 + 0x10),"static const uint8_t %s%s[] = {\n","lj_lib_init_",
                  modname);
          acStack_1d0[0] = '\0';
          puVar12 = obuf;
          if (obuf < optr) {
            iVar13 = 0;
            do {
              iVar5 = sprintf(acStack_1d0 + iVar13,"%d,",(ulong)*puVar12);
              iVar13 = iVar13 + iVar5;
              if (0x4a < iVar13) {
                iVar13 = 0;
                fprintf(*(FILE **)(pcVar11 + 0x10),"%s\n",acStack_1d0);
                acStack_1d0[0] = '\0';
              }
              puVar12 = puVar12 + 1;
            } while (puVar12 < optr);
          }
          fprintf(*(FILE **)(pcVar11 + 0x10),"%s%d\n};\n#endif\n\n",acStack_1d0,0xff);
        }
        return;
      }
    }
    modstate = 0;
    regfunc = 0;
    pFStack_150 = (FILE *)0x10b5e1;
    pcVar10 = fgets((char *)&local_138,0x100,pFVar6);
    pFVar3 = pFVar6;
    pFVar2 = local_140;
    while (local_140 = pFVar3, pcVar10 != (char *)0x0) {
      if ((((byte)local_138._flags == 0x23) && (local_138._flags._1_1_ == 'i')) &&
         (local_138._flags._2_1_ == 'f')) {
        uVar8 = (undefined7)((ulong)unaff_RBP >> 8);
        if (CONCAT35(local_138._IO_read_ptr._0_3_,local_138._3_5_) == 0xa32355f4a4c20 &&
            CONCAT53(local_138._3_5_,0x666923) == 0x355f4a4c20666923) {
          unaff_RBP = (FILE *)CONCAT71(uVar8,1);
        }
        else {
          unaff_RBP = (FILE *)CONCAT71(uVar8,(int)local_138._IO_read_ptr == 0xa0d32 &&
                                             CONCAT53(local_138._3_5_,0x666923) ==
                                             0x355f4a4c20666923);
        }
        if ((char)unaff_RBP == '\0') goto LAB_0010b6fe;
        pFStack_150 = (FILE *)0x10b675;
        pcVar10 = fgets((char *)&local_138,0x100,local_140);
        if (pcVar10 != (char *)0x0) {
          iVar13 = 1;
          do {
            if (local_138._flags._2_1_ == 'n' &&
                (local_138._flags._1_1_ == 'e' && ((byte)local_138._flags ^ 0x23) == 0)) {
              iVar13 = iVar13 + -1;
              if (iVar13 == 0) break;
            }
            else {
              iVar13 = iVar13 + (uint)(local_138._flags._2_1_ == 'f' &&
                                      (((byte)local_138._flags ^ 0x23) == 0 &&
                                      local_138._flags._1_1_ == 'i'));
            }
            pFStack_150 = (FILE *)0x10b6cf;
            pcVar10 = fgets((char *)&local_138,0x100,local_140);
          } while (pcVar10 != (char *)0x0);
        }
        if ((char)unaff_RBP == '\0') goto LAB_0010b6fe;
      }
      else {
LAB_0010b6fe:
        pFVar6 = &local_138;
        while( true ) {
          pFStack_150 = (FILE *)0x10b712;
          pcVar10 = strstr((char *)pFVar6,"LJLIB_");
          if (pcVar10 == (char *)0x0) break;
          pFVar6 = (FILE *)(pcVar10 + 6);
          unaff_R15 = 0;
          unaff_R13 = libdef_handlers + 1;
          pcVar10 = "MODULE_";
          do {
            pFStack_150 = (FILE *)0x10b737;
            unaff_RBP = (FILE *)strlen(pcVar10);
            pFStack_150 = (FILE *)0x10b748;
            uVar4 = strncmp((char *)pFVar6,pcVar10,(size_t)unaff_RBP);
            pcVar10 = (char *)(ulong)uVar4;
            if (uVar4 == 0) {
              pFVar6 = (FILE *)((long)&unaff_RBP->_flags + (long)&pFVar6->_flags);
              if (unaff_R13[-1].stop == (char *)0x0) {
                unaff_RBP = (FILE *)0x0;
              }
              else {
                pFStack_150 = (FILE *)0x10b763;
                unaff_RBP = (FILE *)strcspn((char *)pFVar6,unaff_R13[-1].stop);
              }
              if (*(char *)((long)&unaff_RBP->_flags + (long)&pFVar6->_flags) != '\0') {
                puVar7 = (undefined1 *)((long)&pFVar6->_flags + (long)&unaff_RBP->_flags);
                *puVar7 = 0;
                pFStack_150 = (FILE *)0x10b786;
                (*unaff_R13[-1].func)(ctx,(char *)pFVar6,unaff_R13[-1].arg);
                unaff_RBP = (FILE *)(puVar7 + 1);
                pFVar6 = unaff_RBP;
              }
            }
            if (uVar4 == 0) break;
            pcVar10 = unaff_R13->suffix;
            unaff_R13 = unaff_R13 + 1;
            unaff_R15 = (ulong)(pcVar10 == (char *)0x0);
          } while (pcVar10 != (char *)0x0);
          if (unaff_R15 != 0) {
            pFStack_150 = (FILE *)0x10b981;
            emit_lib_cold_2();
            goto LAB_0010b981;
          }
        }
      }
      pFVar6 = local_140;
      pFStack_150 = (FILE *)0x10b6f0;
      pcVar10 = fgets((char *)&local_138,0x100,local_140);
      pFVar3 = local_140;
      pFVar2 = local_140;
    }
    pFStack_150 = (FILE *)0x10b7b9;
    local_140 = pFVar2;
    fclose(pFVar6);
    if (ctx->mode == BUILD_libdef) {
      pFStack_150 = (FILE *)0x10b7cb;
      libdef_endmodule(ctx);
    }
  }
  switch(ctx->mode) {
  case BUILD_bcdef:
    pFStack_150 = (FILE *)0x10b818;
    fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
    pFStack_150 = (FILE *)0x10b832;
    fwrite("LJ_DATADEF const uint16_t lj_bc_mode[] = {\n",0x2b,1,(FILE *)ctx->fp);
    pFStack_150 = (FILE *)0x10b84c;
    fwrite("BCDEF(BCMODE)\n",0xe,1,(FILE *)ctx->fp);
    if (1 < ffasmfunc) {
      iVar13 = ffasmfunc + 1;
      do {
        pFStack_150 = (FILE *)0x10b876;
        fwrite("BCMODE_FF,\n",0xb,1,(FILE *)ctx->fp);
        iVar13 = iVar13 + -1;
      } while (2 < iVar13);
    }
    pFVar6 = (FILE *)ctx->fp;
    pcVar10 = "BCMODE_FF\n};\n\n";
    sVar9 = 0xe;
    break;
  case BUILD_ffdef:
    pFStack_150 = (FILE *)0x10b92e;
    fwrite("\n#undef FFDEF\n\n",0xf,1,(FILE *)ctx->fp);
    pFStack_150 = (FILE *)0x10b946;
    fprintf((FILE *)ctx->fp,"#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
            (ulong)(uint)ffasmfunc);
    return;
  default:
    goto switchD_0010b7fc_caseD_7;
  case BUILD_recdef:
    pFStack_150 = (FILE *)0x10b8ac;
    fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
    pFStack_150 = (FILE *)0x10b8c6;
    fwrite("static const RecordFunc recff_func[] = {\nrecff_nyi,\nrecff_c",0x3b,1,(FILE *)ctx->fp);
    if (obuf[0] != '\0') {
      puVar12 = obuf;
      do {
        pFStack_150 = (FILE *)0x10b8ee;
        fprintf((FILE *)ctx->fp,",\nrecff_%s",puVar12);
        pFStack_150 = (FILE *)0x10b8f6;
        sVar9 = strlen((char *)puVar12);
        puVar12 = puVar12 + sVar9 + 1;
      } while (*puVar12 != '\0');
    }
    pFVar6 = (FILE *)ctx->fp;
    pcVar10 = "\n};\n\n";
    sVar9 = 5;
    break;
  case BUILD_vmdef:
    pFVar6 = (FILE *)ctx->fp;
    pcVar10 = "},\n\n";
    sVar9 = 4;
  }
  pFStack_150 = (FILE *)0x10b962;
  fwrite(pcVar10,sVar9,1,pFVar6);
switchD_0010b7fc_caseD_7:
  return;
}

Assistant:

void emit_lib(BuildCtx *ctx)
{
  const char *fname;

  if (ctx->mode == BUILD_ffdef || ctx->mode == BUILD_libdef ||
      ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  else if (ctx->mode == BUILD_vmdef)
    fprintf(ctx->fp, "ffnames = {\n[0]=\"Lua\",\n\"C\",\n");
  if (ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "static const uint16_t recff_idmap[] = {\n0,\n0x0100");
  recffid = ffid = FF_C+1;
  ffasmfunc = 0;

  while ((fname = *ctx->args++)) {
    char buf[256];  /* We don't care about analyzing lines longer than that. */
    FILE *fp;
    if (fname[0] == '-' && fname[1] == '\0') {
      fp = stdin;
    } else {
      fp = fopen(fname, "r");
      if (!fp) {
	fprintf(stderr, "Error: cannot open input file '%s': %s\n",
		fname, strerror(errno));
	exit(1);
      }
    }
    modstate = 0;
    regfunc = REGFUNC_OK;
    while (fgets(buf, sizeof(buf), fp) != NULL) {
      char *p;
      /* Simplistic pre-processor. Only handles top-level #if/#endif. */
      if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
        int ok = 1;
        if (!strcmp(buf, "#if LJ_52\n") || !strcmp(buf, "#if LJ_52\r\n"))
          ok = LJ_52;
        else if (!strcmp(buf, "#if LJ_HASJIT\n") || !strcmp(buf, "#if LJ_HASJIT\r\n"))
          ok = LJ_HASJIT;
        else if (!strcmp(buf, "#if LJ_HASFFI\n") || !strcmp(buf, "#if LJ_HASFFI\r\n"))
          ok = LJ_HASFFI;
        else if (!strcmp(buf, "#if LJ_HASBUFFER\n") || !strcmp(buf, "#if LJ_HASBUFFER\r\n"))
          ok = LJ_HASBUFFER;
        if (!ok) {
          int lvl = 1;
          while (fgets(buf, sizeof(buf), fp) != NULL) {
            if (buf[0] == '#' && buf[1] == 'e' && buf[2] == 'n') {
              if (--lvl == 0) break;
            } else if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
              lvl++;
            }
          }
          continue;
        }
      }
      for (p = buf; (p = strstr(p, LIBDEF_PREFIX)) != NULL; ) {
        const LibDefHandler *ldh;
        p += sizeof(LIBDEF_PREFIX)-1;
        for (ldh = libdef_handlers; ldh->suffix != NULL; ldh++) {
          size_t n, len = strlen(ldh->suffix);
          if (!strncmp(p, ldh->suffix, len)) {
            p += len;
            n = ldh->stop ? strcspn(p, ldh->stop) : 0;
            if (!p[n]) break;
            p[n] = '\0';
            ldh->func(ctx, p, ldh->arg);
            p += n+1;
            break;
          }
        }
        if (ldh->suffix == NULL) {
          buf[strlen(buf)-1] = '\0';
          fprintf(stderr, "Error: unknown library definition tag %s%s\n",
            LIBDEF_PREFIX, p);
          exit(1);
        }
      }
    }
    fclose(fp);
    if (ctx->mode == BUILD_libdef) {
      libdef_endmodule(ctx);
    }
  }

  if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "\n#undef FFDEF\n\n");
    fprintf(ctx->fp,
      "#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
      ffasmfunc);
  } else if (ctx->mode == BUILD_vmdef) {
    fprintf(ctx->fp, "},\n\n");
  } else if (ctx->mode == BUILD_bcdef) {
    int i;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "LJ_DATADEF const uint16_t lj_bc_mode[] = {\n");
    fprintf(ctx->fp, "BCDEF(BCMODE)\n");
    for (i = ffasmfunc-1; i > 0; i--)
      fprintf(ctx->fp, "BCMODE_FF,\n");
    fprintf(ctx->fp, "BCMODE_FF\n};\n\n");
  } else if (ctx->mode == BUILD_recdef) {
    char *p = (char *)obuf;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "static const RecordFunc recff_func[] = {\n"
	    "recff_nyi,\n"
	    "recff_c");
    while (*p) {
      fprintf(ctx->fp, ",\nrecff_%s", p);
      p += strlen(p)+1;
    }
    fprintf(ctx->fp, "\n};\n\n");
  }
}